

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O2

void __thiscall Am_Font_Data::Print(Am_Font_Data *this,ostream *os)

{
  Am_Font_Size_Flag AVar1;
  ostream *poVar2;
  char *pcVar3;
  
  if (this->name == (char *)0x0) {
    poVar2 = std::operator<<(os,"Am_Font(");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::operator<<(poVar2,")=[");
    if ((ulong)this->family < 7) {
      std::operator<<(os,&DAT_0028c854 + *(int *)(&DAT_0028c854 + (ulong)this->family * 4));
    }
    if (this->bold == true) {
      std::operator<<(os,", BOLD");
    }
    if (this->italic == true) {
      std::operator<<(os,", ITALIC");
    }
    if (this->underline == true) {
      std::operator<<(os,", UNDERLINE");
    }
    AVar1 = this->size;
    if (((ulong)AVar1 < 0x14) && ((0xf000fU >> (AVar1 & 0x1f) & 1) != 0)) {
      std::operator<<(os,&DAT_0028c870 + *(int *)(&DAT_0028c870 + (ulong)AVar1 * 4));
    }
    pcVar3 = "]";
  }
  else {
    poVar2 = std::operator<<(os,"Am_Font From File(");
    os = std::operator<<(poVar2,this->name);
    pcVar3 = ")";
  }
  std::operator<<(os,pcVar3);
  return;
}

Assistant:

void
Am_Font_Data::Print(std::ostream &os) const
{
  const char *lookup_name = nullptr;
#ifdef DEBUG
  lookup_name = Am_Get_Name_Of_Item(this);
#endif
  if (lookup_name)
    os << lookup_name;
  else if (name)
    os << "Am_Font From File(" << name << ")";
  else {
    os << "Am_Font(" << std::hex << (unsigned long)this << std::dec << ")=[";
    switch (family) {
    case Am_FONT_FIXED:
      os << "FIXED";
      break;
    case Am_FONT_SERIF:
      os << "SERIF";
      break;
    case Am_FONT_SANS_SERIF:
      os << "SANS_SERIF";
      break;
    case Am_FONT_JFIXED:
      os << "JFIXED";
      break;
    case Am_FONT_JPROPORTIONAL:
      os << "JPROPORTIONAL";
      break;
    case Am_FONT_CFIXED:
      os << "CFIXED";
      break;
    case Am_FONT_KFIXED:
      os << "KFIXED";
      break;
    }
    if (bold)
      os << ", BOLD";
    if (italic)
      os << ", ITALIC";
    if (underline)
      os << ", UNDERLINE";
    switch (size) {
    case Am_FONT_SMALL:
      os << ", SMALL";
      break;
    case Am_FONT_MEDIUM:
      os << ", MEDIUM";
      break;
    case Am_FONT_LARGE:
      os << ", LARGE";
      break;
    case Am_FONT_VERY_LARGE:
      os << ", VERY_LARGE";
      break;
    case Am_FONT_TSMALL:
      os << ", TSMALL";
      break;
    case Am_FONT_TMEDIUM:
      os << ", TMEDIUM";
      break;
    case Am_FONT_TLARGE:
      os << ", TLARGE";
      break;
    case Am_FONT_TVERY_LARGE:
      os << ", TVERY_LARGE";
      break;
    }
    os << "]";
  }
}